

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

bool pbrt::RealisticCamera::IntersectSphericalElement
               (Float radius,Float zCenter,Ray *ray,Float *t,Normal3f *n)

{
  undefined8 uVar1;
  Vector3<float> v;
  Vector3<float> v_00;
  Tuple3<pbrt::Vector3,_float> t_00;
  Vector3<float> v_01;
  Normal3<float> n_00;
  bool bVar2;
  float *pfVar3;
  undefined8 *in_RDX;
  float *in_RSI;
  Tuple3<pbrt::Vector3,_float> *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar10 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Point3<float> PVar12;
  Vector3<float> VVar13;
  Normal3<float> NVar14;
  bool useCloserT;
  Float t1;
  Float t0;
  Float C;
  Float B;
  Float A;
  Point3f o;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  float in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  float in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea4;
  float fVar15;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffec4;
  float fVar17;
  undefined8 local_84;
  undefined4 local_7c;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_34;
  float local_2c;
  undefined8 *local_28;
  float *local_20;
  Tuple3<pbrt::Vector3,_float> *local_18;
  float local_8;
  bool local_1;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar7 [64];
  float fVar11;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_8 = in_XMM0_Da;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_RDI,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,0.0);
  local_48 = local_38;
  local_50 = local_40;
  auVar10 = ZEXT856(0);
  VVar13.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe64;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe60;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe68;
  PVar12 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                      ,VVar13);
  local_58 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar10;
  local_60 = vmovlpd_avx(auVar4._0_16_);
  local_64 = ((Tuple3<pbrt::Vector3,_float> *)&local_18[1].x)->x *
             ((Tuple3<pbrt::Vector3,_float> *)&local_18[1].x)->x + local_18[1].y * local_18[1].y +
             local_18[1].z * local_18[1].z;
  local_34._0_4_ = (float)local_60;
  local_34._4_4_ = (float)((ulong)local_60 >> 0x20);
  local_68 = (((Tuple3<pbrt::Vector3,_float> *)&local_18[1].x)->x * (float)local_34 +
              local_18[1].y * local_34._4_4_ + local_18[1].z * local_58) * 2.0;
  local_6c = ((float)local_34 * (float)local_34 + local_34._4_4_ * local_34._4_4_ +
             local_58 * local_58) - local_8 * local_8;
  local_34 = local_60;
  local_2c = local_58;
  bVar2 = Quadratic(in_stack_fffffffffffffe60,(float)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                    (float)in_stack_fffffffffffffe58,
                    (float *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    (float *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (bVar2) {
    if (0.0 < local_18[1].z == local_8 < 0.0) {
      pfVar3 = std::max<float>(&local_70,&local_74);
      fVar11 = *pfVar3;
    }
    else {
      pfVar3 = std::min<float>(&local_70,&local_74);
      fVar11 = *pfVar3;
    }
    *local_20 = fVar11;
    if (0.0 <= *local_20) {
      auVar10 = (undefined1  [56])0x0;
      t_00.y = (float)in_stack_fffffffffffffe6c;
      t_00.x = in_stack_fffffffffffffe68;
      t_00.z = in_stack_fffffffffffffe70;
      VVar13 = pbrt::operator*(in_stack_fffffffffffffe54,t_00);
      auVar5._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar10;
      vmovlpd_avx(auVar5._0_16_);
      auVar10 = ZEXT856(0);
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe64;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe60;
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe68;
      PVar12 = Point3<float>::operator+
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),v_00);
      auVar6._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar6._8_56_ = auVar10;
      vmovlpd_avx(auVar6._0_16_);
      PVar12.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffe50;
      PVar12.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffe4c;
      PVar12.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe54;
      Vector3<float>::Vector3<float>((Vector3<float> *)0x85f20a,PVar12);
      v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe50;
      v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe4c;
      v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe54;
      Normal3<float>::Normal3<float>((Normal3<float> *)0x85f247,v);
      *(undefined4 *)(local_28 + 1) = local_7c;
      *local_28 = local_84;
      uVar16 = *(undefined4 *)(local_28 + 1);
      fVar15 = (float)*local_28;
      auVar10 = ZEXT856(0);
      NVar14.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffe90;
      NVar14.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffe88;
      NVar14.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      NVar14 = Normalize<float>(NVar14);
      fVar11 = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar7._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar7._8_56_ = auVar10;
      uVar1 = vmovlpd_avx(auVar7._0_16_);
      fVar17 = (float)uVar1;
      VVar13 = Tuple3<pbrt::Vector3,_float>::operator-(in_RDI);
      auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar10;
      vmovlpd_avx(auVar8._0_16_);
      auVar10 = ZEXT856(0);
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffec4;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar16;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar17;
      v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffea4;
      v_01.super_Tuple3<pbrt::Vector3,_float>.x = fVar11;
      v_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar15;
      NVar14 = FaceForward<float>(n_00,v_01);
      auVar9._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar9._8_56_ = auVar10;
      uVar1 = vmovlpd_avx(auVar9._0_16_);
      *local_28 = uVar1;
      *(float *)(local_28 + 1) = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PBRT_CPU_GPU
    static bool IntersectSphericalElement(Float radius, Float zCenter, const Ray &ray,
                                          Float *t, Normal3f *n) {
        // Compute _t0_ and _t1_ for ray--element intersection
        Point3f o = ray.o - Vector3f(0, 0, zCenter);
        Float A = ray.d.x * ray.d.x + ray.d.y * ray.d.y + ray.d.z * ray.d.z;
        Float B = 2 * (ray.d.x * o.x + ray.d.y * o.y + ray.d.z * o.z);
        Float C = o.x * o.x + o.y * o.y + o.z * o.z - radius * radius;
        Float t0, t1;
        if (!Quadratic(A, B, C, &t0, &t1))
            return false;

        // Select intersection $t$ based on ray direction and element curvature
        bool useCloserT = (ray.d.z > 0) ^ (radius < 0);
        *t = useCloserT ? std::min(t0, t1) : std::max(t0, t1);
        if (*t < 0)
            return false;

        // Compute surface normal of element at ray intersection point
        *n = Normal3f(Vector3f(o + *t * ray.d));
        *n = FaceForward(Normalize(*n), -ray.d);

        return true;
    }